

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vector<int,_4> __thiscall
tcu::swizzleRB<int>(tcu *this,Vector<int,_4> *v,ChannelOrder src,ChannelOrder dst)

{
  undefined8 extraout_RDX;
  Vector<int,_4> VVar2;
  ChannelOrder dst_local;
  ChannelOrder src_local;
  Vector<int,_4> *v_local;
  undefined8 uVar1;
  
  if (src == dst) {
    Vector<int,_4>::Vector((Vector<int,_4> *)this,v);
    uVar1 = extraout_RDX;
  }
  else {
    VVar2 = Vector<int,_4>::swizzle((Vector<int,_4> *)this,(int)v,2,1,0);
    uVar1 = VVar2.m_data._8_8_;
  }
  VVar2.m_data[2] = (int)uVar1;
  VVar2.m_data[3] = (int)((ulong)uVar1 >> 0x20);
  VVar2.m_data._0_8_ = this;
  return (Vector<int,_4>)VVar2.m_data;
}

Assistant:

Vector<T, 4> swizzleRB (const Vector<T, 4>& v, TextureFormat::ChannelOrder src, TextureFormat::ChannelOrder dst)
{
	if (src == dst)
		return v;
	else
	{
		DE_ASSERT((src == TextureFormat::RGB && dst == TextureFormat::BGR) ||
				  (src == TextureFormat::BGR && dst == TextureFormat::RGB) ||
				  (src == TextureFormat::RGBA && dst == TextureFormat::BGRA) ||
				  (src == TextureFormat::BGRA && dst == TextureFormat::RGBA));
		return v.swizzle(2,1,0,3);
	}
}